

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O0

int __thiscall FIX::FileStore::open(FileStore *this,char *__file,int __oflag,...)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  FILE *pFVar4;
  ConfigError *pCVar5;
  allocator<char> local_b9;
  string local_b8;
  byte local_92;
  undefined1 local_91;
  undefined1 local_90 [6];
  bool setCreationTime;
  undefined1 local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_45;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  byte local_11;
  FileStore *pFStack_10;
  bool deleteFile_local;
  FileStore *this_local;
  
  local_11 = (byte)__file & 1;
  pFStack_10 = this;
  if (this->m_msgFile != (FILE *)0x0) {
    fclose((FILE *)this->m_msgFile);
  }
  if (this->m_headerFile != (FILE *)0x0) {
    fclose((FILE *)this->m_headerFile);
  }
  if (this->m_seqNumsFile != (FILE *)0x0) {
    fclose((FILE *)this->m_seqNumsFile);
  }
  if (this->m_sessionFile != (FILE *)0x0) {
    fclose((FILE *)this->m_sessionFile);
  }
  this->m_msgFile = (FILE *)0x0;
  this->m_headerFile = (FILE *)0x0;
  this->m_seqNumsFile = (FILE *)0x0;
  this->m_sessionFile = (FILE *)0x0;
  if ((local_11 & 1) != 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    file_unlink(pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    file_unlink(pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    file_unlink(pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    file_unlink(pcVar3);
  }
  populateCache(this);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pFVar4 = file_fopen(pcVar3,"r+");
  this->m_msgFile = pFVar4;
  if (this->m_msgFile == (FILE *)0x0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFVar4 = file_fopen(pcVar3,"w+");
    this->m_msgFile = pFVar4;
  }
  if (this->m_msgFile == (FILE *)0x0) {
    local_45 = 1;
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_38,"Could not open body file: ",&this->m_msgFileName);
    ConfigError::ConfigError(pCVar5,&local_38);
    local_45 = 0;
    __cxa_throw(pCVar5,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pFVar4 = file_fopen(pcVar3,"r+");
  this->m_headerFile = pFVar4;
  if (this->m_headerFile == (FILE *)0x0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFVar4 = file_fopen(pcVar3,"w+");
    this->m_headerFile = pFVar4;
  }
  if (this->m_headerFile == (FILE *)0x0) {
    local_69 = 1;
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_68,"Could not open header file: ",&this->m_headerFileName);
    ConfigError::ConfigError(pCVar5,&local_68);
    local_69 = 0;
    __cxa_throw(pCVar5,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pFVar4 = file_fopen(pcVar3,"r+");
  this->m_seqNumsFile = pFVar4;
  if (this->m_seqNumsFile == (FILE *)0x0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFVar4 = file_fopen(pcVar3,"w+");
    this->m_seqNumsFile = pFVar4;
  }
  if (this->m_seqNumsFile == (FILE *)0x0) {
    local_91 = 1;
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   "Could not open seqnums file: ",&this->m_seqNumsFileName);
    ConfigError::ConfigError(pCVar5,(string *)local_90);
    local_91 = 0;
    __cxa_throw(pCVar5,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  local_92 = 0;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pFVar4 = file_fopen(pcVar3,"r");
  this->m_sessionFile = pFVar4;
  if (this->m_sessionFile == (FILE *)0x0) {
    local_92 = 1;
  }
  else {
    fclose((FILE *)this->m_sessionFile);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pFVar4 = file_fopen(pcVar3,"r+");
  this->m_sessionFile = pFVar4;
  if (this->m_sessionFile == (FILE *)0x0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFVar4 = file_fopen(pcVar3,"w+");
    this->m_sessionFile = pFVar4;
  }
  if (this->m_sessionFile == (FILE *)0x0) {
    pCVar5 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Could not open session file",&local_b9);
    ConfigError::ConfigError(pCVar5,&local_b8);
    __cxa_throw(pCVar5,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  if ((local_92 & 1) != 0) {
    setSession(this);
  }
  uVar1 = (*(this->super_MessageStore)._vptr_MessageStore[4])();
  (*(this->super_MessageStore)._vptr_MessageStore[6])(this,(ulong)uVar1);
  uVar1 = (*(this->super_MessageStore)._vptr_MessageStore[5])();
  iVar2 = (*(this->super_MessageStore)._vptr_MessageStore[7])(this,(ulong)uVar1);
  return iVar2;
}

Assistant:

void FileStore::open( bool deleteFile )
{
  if ( m_msgFile ) fclose( m_msgFile );
  if ( m_headerFile ) fclose( m_headerFile );
  if ( m_seqNumsFile ) fclose( m_seqNumsFile );
  if ( m_sessionFile ) fclose( m_sessionFile );

  m_msgFile = 0;
  m_headerFile = 0;
  m_seqNumsFile = 0;
  m_sessionFile = 0;

  if ( deleteFile )
  {
    file_unlink( m_msgFileName.c_str() );
    file_unlink( m_headerFileName.c_str() );
    file_unlink( m_seqNumsFileName.c_str() );
    file_unlink( m_sessionFileName.c_str() );
  }

  populateCache();
  m_msgFile = file_fopen( m_msgFileName.c_str(), "r+" );
  if ( !m_msgFile ) m_msgFile = file_fopen( m_msgFileName.c_str(), "w+" );
  if ( !m_msgFile ) throw ConfigError( "Could not open body file: " + m_msgFileName );

  m_headerFile = file_fopen( m_headerFileName.c_str(), "r+" );
  if ( !m_headerFile ) m_headerFile = file_fopen( m_headerFileName.c_str(), "w+" );
  if ( !m_headerFile ) throw ConfigError( "Could not open header file: " + m_headerFileName );

  m_seqNumsFile = file_fopen( m_seqNumsFileName.c_str(), "r+" );
  if ( !m_seqNumsFile ) m_seqNumsFile = file_fopen( m_seqNumsFileName.c_str(), "w+" );
  if ( !m_seqNumsFile ) throw ConfigError( "Could not open seqnums file: " + m_seqNumsFileName );

  bool setCreationTime = false;
  m_sessionFile = file_fopen( m_sessionFileName.c_str(), "r" );
  if ( !m_sessionFile ) setCreationTime = true;
  else fclose( m_sessionFile );

  m_sessionFile = file_fopen( m_sessionFileName.c_str(), "r+" );
  if ( !m_sessionFile ) m_sessionFile = file_fopen( m_sessionFileName.c_str(), "w+" );
  if ( !m_sessionFile ) throw ConfigError( "Could not open session file" );
  if ( setCreationTime ) setSession();

  setNextSenderMsgSeqNum( getNextSenderMsgSeqNum() );
  setNextTargetMsgSeqNum( getNextTargetMsgSeqNum() );
}